

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client.cpp
# Opt level: O1

int input(WINDOW *win,char *str,int len,bool cont)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  
  iVar6 = -1;
  iVar7 = -1;
  if (win != (WINDOW *)0x0) {
    iVar7 = win->_maxy + 1;
    iVar6 = win->_maxx + 1;
  }
  uVar5 = 0;
  do {
    iVar2 = wgetch(win);
    iVar4 = (int)uVar5;
    if (iVar2 == 0x157) {
LAB_001024a8:
      if (iVar4 < 1) goto LAB_00102564;
      bVar1 = false;
    }
    else {
      if (iVar2 == 0x107) {
        if (0 < iVar4) {
          uVar5 = (ulong)(iVar4 - 1);
          str[uVar5] = '\0';
          iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mutwin);
          if (iVar2 != 0) goto LAB_0010266f;
          iVar4 = -1;
          iVar2 = -1;
          if (win != (WINDOW *)0x0) {
            iVar2 = (int)win->_cury;
            iVar4 = (int)win->_curx;
          }
          if (iVar4 < 1) {
            if (0 < iVar2) {
              iVar2 = iVar2 + -1;
              iVar4 = ncolums;
              goto LAB_0010250a;
            }
          }
          else {
LAB_0010250a:
            iVar4 = iVar4 + -1;
            iVar3 = wmove(win,iVar2,iVar4);
            if (iVar3 != -1) {
              waddch(win,0x20);
            }
          }
          wmove(win,iVar2,iVar4);
          pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
        }
      }
      else {
        if (iVar2 == 10) goto LAB_001024a8;
        if ((((0xb < iVar2 - 0x109U) && (3 < iVar2 - 0x102U)) && (iVar2 != 9)) &&
           ((iVar2 != 0x1b && (iVar4 < len)))) {
          uVar5 = (ulong)(iVar4 + 1);
          str[iVar4] = (char)iVar2;
          waddch(win,iVar2);
        }
      }
LAB_00102564:
      iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mutwin);
      if (iVar2 != 0) {
LAB_0010266f:
        std::__throw_system_error(iVar2);
      }
      iVar4 = -1;
      iVar2 = -1;
      if (win != (WINDOW *)0x0) {
        iVar2 = (int)win->_cury;
        iVar4 = (int)win->_curx;
      }
      if ((iVar2 == iVar7) && (iVar4 == iVar6)) {
        iVar7 = iVar7 + 1;
        wresize(win,iVar7,iVar6);
      }
      if (cont) {
        wattr_on(win,0x6600,0);
        mvwprintw(win,0,ncolums + -10,"%d/%d",uVar5,len);
        wattr_off(win,0x6600,0);
      }
      wmove(win,iVar2,iVar4);
      wrefresh(win);
      pthread_mutex_unlock((pthread_mutex_t *)&mutwin);
      bVar1 = true;
    }
    if (!bVar1) {
      return (int)uVar5;
    }
  } while( true );
}

Assistant:

int  input(WINDOW *win, char *str, int len, bool cont) {
  int ymax, xmax;
  getmaxyx(win, ymax, xmax);
  int i = 0;
  while(1) {
    int c = wgetch(win);
    if(c == KEY_ENTER || c == 10) {
      if (i > 0)
        break;
    }
    else if (c == KEY_BACKSPACE) {
      if (i > 0) {
        str[--i] = '\0';
        int y, x;
        mutwin.lock();
        getyx(win, y, x);
        if (x > 0) {
          mvwaddch(win, y, --x, ' ');
        }
        else if (y > 0) {
          y--;
          x = ncolums;
          mvwaddch(win, y, --x, ' ');
        }
        wmove(win, y, x);
        mutwin.unlock();
      }
    }
    else if (!((265 <= c && 276 >=c) || (258 <= c && 261 >= c ) || (c == 27) || c == 9)) {
      if (i < len) {
        str[i++] = c;
        waddch(win, c);
      }
    }
    int x, y;

    mutwin.lock();
    getyx(win, y, x);
    if(y == ymax && x == xmax) {
      wresize(win, ++ymax, xmax);
    }
    if (cont) {
      wattron(win, COLOR_PAIR(102));
      mvwprintw(win, 0, ncolums - 10, "%d/%d", i, len);
      wattroff(win, COLOR_PAIR(102));
    }
    wmove(win, y,x);
    wrefresh(win);
    mutwin.unlock();
  }
  return (i);
}